

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncInfo.cpp
# Opt level: O3

void __thiscall FuncInfo::ReleaseReference(FuncInfo *this,ParseNode *pnode)

{
  OpCode OVar1;
  code *pcVar2;
  bool bVar3;
  ParseNodeBin *pPVar4;
  ParseNodeCall *pPVar5;
  undefined4 *puVar6;
  ParseNodePtr this_00;
  RegSlot RVar7;
  RegSlot tmpReg;
  
  OVar1 = pnode->nop;
  if (OVar1 < knopDot) {
    if (OVar1 == knopName) {
      return;
    }
    if (OVar1 != knopCall) {
LAB_0089ef8e:
      RVar7 = pnode->location;
      goto LAB_0089f0e2;
    }
LAB_0089eee2:
    pPVar5 = ParseNode::AsParseNodeCall(pnode);
    if (pPVar5->pnodeArgs != (ParseNodePtr)0x0) {
      pPVar5 = ParseNode::AsParseNodeCall(pnode);
      this_00 = pPVar5->pnodeArgs;
      RVar7 = 0xffffffff;
      if (this_00->nop == knopList) {
        tmpReg = 0xffffffff;
        do {
          pPVar4 = ParseNode::AsParseNodeBin(this_00);
          bVar3 = IsTmpReg(this,pPVar4->pnode1->location);
          if (bVar3) {
            pPVar4 = ParseNode::AsParseNodeBin(this_00);
            tmpReg = pPVar4->pnode1->location;
            if (RVar7 == 0xffffffff) {
              RVar7 = tmpReg;
            }
          }
          pPVar4 = ParseNode::AsParseNodeBin(this_00);
          this_00 = pPVar4->pnode2;
        } while (this_00->nop == knopList);
      }
      else {
        tmpReg = 0xffffffff;
      }
      bVar3 = IsTmpReg(this,this_00->location);
      if ((bVar3) && (tmpReg = this_00->location, RVar7 == 0xffffffff)) {
        RVar7 = tmpReg;
      }
      if (tmpReg != 0xffffffff) {
        if (RVar7 == 0xffffffff) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/FuncInfo.cpp"
                             ,0x157,"(firstArg != Js::Constants::NoRegister)",
                             "firstArg != Js::Constants::NoRegister");
          if (!bVar3) goto LAB_0089f12e;
          *puVar6 = 0;
        }
        if (tmpReg < RVar7) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar6 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/FuncInfo.cpp"
                             ,0x158,"(lastArg >= firstArg)","lastArg >= firstArg");
          if (!bVar3) {
LAB_0089f12e:
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar6 = 0;
        }
        do {
          ReleaseTmpRegister(this,tmpReg);
          bVar3 = RVar7 < tmpReg;
          tmpReg = tmpReg - 1;
        } while (bVar3);
      }
    }
    pPVar5 = ParseNode::AsParseNodeCall(pnode);
    if ((pPVar5->field_0x24 & 8) != 0) {
      return;
    }
    pPVar5 = ParseNode::AsParseNodeCall(pnode);
    OVar1 = pPVar5->pnodeTarget->nop;
    if ((OVar1 != knopIndex) && (OVar1 != knopDot)) {
      pPVar5 = ParseNode::AsParseNodeCall(pnode);
      ReleaseLoad(this,pPVar5->pnodeTarget);
      return;
    }
    pPVar5 = ParseNode::AsParseNodeCall(pnode);
    ReleaseReference(this,pPVar5->pnodeTarget);
    pPVar5 = ParseNode::AsParseNodeCall(pnode);
  }
  else {
    if (OVar1 == knopIndex) {
      pPVar4 = ParseNode::AsParseNodeBin(pnode);
      if ((pPVar4->pnode2 != (ParseNodePtr)0x0) &&
         (RVar7 = pPVar4->pnode2->location, RVar7 != 0xffffffff)) {
        ReleaseTmpRegister(this,RVar7);
      }
    }
    else {
      if (OVar1 == knopNew) goto LAB_0089eee2;
      if (OVar1 != knopDot) goto LAB_0089ef8e;
    }
    pPVar5 = (ParseNodeCall *)ParseNode::AsParseNodeBin(pnode);
  }
  if (pPVar5->pnodeTarget == (ParseNodePtr)0x0) {
    return;
  }
  RVar7 = pPVar5->pnodeTarget->location;
LAB_0089f0e2:
  if (RVar7 == 0xffffffff) {
    return;
  }
  ReleaseTmpRegister(this,RVar7);
  return;
}

Assistant:

void FuncInfo::ReleaseReference(ParseNode *pnode)
{
    // Release any temp(s) assigned to this reference expression so they can be re-used.
    switch (pnode->nop)
    {
    case knopDot:
        this->ReleaseLoc(pnode->AsParseNodeBin()->pnode1);
        break;

    case knopIndex:
        this->ReleaseLoc(pnode->AsParseNodeBin()->pnode2);
        this->ReleaseLoc(pnode->AsParseNodeBin()->pnode1);
        break;

    case knopName:
        // Do nothing (see EmitReference)
        break;

    case knopCall:
    case knopNew:
        // For call/new, we have to release the ArgOut register(s) in reverse order,
        // but we have the args in a singly linked list.
        // Fortunately, we know that the set we have to release is sequential.
        // So find the endpoints of the list and release them in descending order.
        if (pnode->AsParseNodeCall()->pnodeArgs)
        {
            ParseNode *pnodeArg = pnode->AsParseNodeCall()->pnodeArgs;
            Js::RegSlot firstArg = Js::Constants::NoRegister;
            Js::RegSlot lastArg = Js::Constants::NoRegister;
            if (pnodeArg->nop == knopList)
            {
                do
                {
                    if (this->IsTmpReg(pnodeArg->AsParseNodeBin()->pnode1->location))
                    {
                        lastArg = pnodeArg->AsParseNodeBin()->pnode1->location;
                        if (firstArg == Js::Constants::NoRegister)
                        {
                            firstArg = lastArg;
                        }
                    }
                    pnodeArg = pnodeArg->AsParseNodeBin()->pnode2;
                }
                while (pnodeArg->nop == knopList);
            }
            if (this->IsTmpReg(pnodeArg->location))
            {
                lastArg = pnodeArg->location;
                if (firstArg == Js::Constants::NoRegister)
                {
                    // Just one: first and last point to the same node.
                    firstArg = lastArg;
                }
            }
            if (lastArg != Js::Constants::NoRegister)
            {
                Assert(firstArg != Js::Constants::NoRegister);
                Assert(lastArg >= firstArg);
                do
                {
                    // Walk down from last to first.
                    this->ReleaseTmpRegister(lastArg);
                } while (lastArg-- > firstArg); // these are unsigned, so (--lastArg >= firstArg) will cause an infinite loop if firstArg is 0 (although that shouldn't happen)
            }
        }
        // Now release the call target.
        if (!pnode->AsParseNodeCall()->isSuperCall)
        {
            switch (pnode->AsParseNodeCall()->pnodeTarget->nop)
            {
            case knopDot:
            case knopIndex:
                this->ReleaseReference(pnode->AsParseNodeCall()->pnodeTarget);
                this->ReleaseLoc(pnode->AsParseNodeCall()->pnodeTarget);
                break;
            default:
                this->ReleaseLoad(pnode->AsParseNodeCall()->pnodeTarget);
            break;
            }
        }
        break;
    default:
        this->ReleaseLoc(pnode);
        break;
    }
}